

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  StorageClass SVar1;
  undefined1 *puVar2;
  string *psVar3;
  bool bVar4;
  uint32_t uVar5;
  BaseType input_type;
  BaseType BVar6;
  GLSLstd450 GVar7;
  uint32_t uVar8;
  SPIRExpression *pSVar9;
  mapped_type *pmVar10;
  SPIRType *pSVar11;
  char *pcVar12;
  ulong uVar13;
  SPIRConstant *pSVar14;
  SPIRVariable *pSVar15;
  Variant *pVVar16;
  _Alloc_hider _Var17;
  char (*ts_2) [3];
  uint32_t op2;
  __node_gen_type __node_gen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_d8;
  string local_b8;
  string local_98;
  uint32_t local_74;
  string local_70;
  string local_50;
  
  ts_2 = (char (*) [3])args;
  local_74 = id;
  uVar5 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  input_type = to_signed_basetype(uVar5);
  BVar6 = to_unsigned_basetype(uVar5);
  GVar7 = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  switch(GVar7) {
  case GLSLstd450RoundEven:
    uVar5 = *args;
    pcVar12 = "rint";
    break;
  default:
    goto switchD_002b59e0_caseD_3;
  case GLSLstd450Sinh:
    uVar5 = *args;
    pcVar12 = "fast::sinh";
    break;
  case GLSLstd450Cosh:
    uVar5 = *args;
    pcVar12 = "fast::cosh";
    break;
  case GLSLstd450Tanh:
    uVar5 = *args;
    pcVar12 = "precise::tanh";
    break;
  case GLSLstd450Atan2:
    uVar5 = *args;
    uVar8 = args[1];
    pcVar12 = "precise::atan2";
    goto LAB_002b6195;
  case GLSLstd450InverseSqrt:
    uVar5 = *args;
    pcVar12 = "rsqrt";
    break;
  case GLSLstd450MatrixInverse:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar5 = pSVar11->columns;
    if (uVar5 == 4) {
      uVar5 = *args;
      pcVar12 = "spvInverse4x4";
    }
    else if (uVar5 == 3) {
      uVar5 = *args;
      pcVar12 = "spvInverse3x3";
    }
    else {
      if (uVar5 != 2) {
        return;
      }
      uVar5 = *args;
      pcVar12 = "spvInverse2x2";
    }
    break;
  case GLSLstd450Modf:
  case GLSLstd450Frexp:
    uVar5 = args[1];
    uVar13 = (ulong)uVar5;
    if ((uVar13 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar16 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.ptr, pVVar16[uVar13].type == TypeExpression
       )) {
      pSVar9 = Variant::get<spirv_cross::SPIRExpression>(pVVar16 + uVar13);
      uVar5 = args[1];
    }
    else {
      pSVar9 = (SPIRExpression *)0x0;
    }
    pSVar11 = Compiler::expression_type((Compiler *)this,uVar5);
    SVar1 = pSVar11->storage;
    if (((2 < SVar1 - StorageClassPrivate) && (SVar1 != StorageClassInput)) &&
       ((SVar1 != StorageClassOutput || (this->capture_output_to_buffer != false)))) {
LAB_002b5a6b:
      CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
      local_b8._M_dataplus._M_p =
           (pointer)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_b8._M_dataplus._M_p,&local_74);
      pmVar10 = ::std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&(this->super_CompilerGLSL).extra_sub_expressions,&local_74);
      if (*pmVar10 == 0) {
        uVar5 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        *pmVar10 = uVar5;
      }
      uVar5 = Compiler::expression_type_id((Compiler *)this,args[1]);
      uVar5 = Compiler::get_pointee_type_id((Compiler *)this,uVar5);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,uVar5,*pmVar10);
      pcVar12 = "frexp";
      if (eop == 0x23) {
        pcVar12 = "modf";
      }
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,result_type,local_74,*args,*pmVar10,pcVar12);
      CompilerGLSL::to_expression_abi_cxx11_(&local_b8,&this->super_CompilerGLSL,args[1],true);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*pmVar10,true);
      CompilerGLSL::
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,&local_b8,(char (*) [4])0x35bea6,&local_d8,
                 (char (*) [2])0x344553);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      goto LAB_002b5d5c;
    }
    if ((pSVar9 != (SPIRExpression *)0x0) && (pSVar9->access_chain == true)) {
      pSVar11 = Compiler::expression_type((Compiler *)this,args[1]);
      bVar4 = Compiler::is_scalar((Compiler *)this,pSVar11);
      if (bVar4) goto LAB_002b5a6b;
    }
    goto switchD_002b59e0_caseD_3;
  case GLSLstd450FMin:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar5 = *args;
    uVar8 = args[1];
    if (*(int *)&(pSVar11->super_IVariant).field_0xc == 0xd) {
      pcVar12 = "fast::min";
      goto LAB_002b6195;
    }
    goto LAB_002b602f;
  case GLSLstd450FMax:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar5 = *args;
    uVar8 = args[1];
    if (*(int *)&(pSVar11->super_IVariant).field_0xc == 0xd) {
      pcVar12 = "fast::max";
      goto LAB_002b6195;
    }
    goto LAB_002b6189;
  case GLSLstd450FClamp:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar5 = *args;
    uVar8 = args[1];
    op2 = args[2];
    if (*(int *)&(pSVar11->super_IVariant).field_0xc == 0xd) {
      pcVar12 = "fast::clamp";
      goto LAB_002b6272;
    }
    goto LAB_002b626b;
  case GLSLstd450PackSnorm4x8:
    uVar5 = *args;
    pcVar12 = "pack_float_to_snorm4x8";
    break;
  case GLSLstd450PackUnorm4x8:
    uVar5 = *args;
    pcVar12 = "pack_float_to_unorm4x8";
    break;
  case GLSLstd450PackSnorm2x16:
    uVar5 = *args;
    pcVar12 = "pack_float_to_snorm2x16";
    break;
  case GLSLstd450PackUnorm2x16:
    uVar5 = *args;
    pcVar12 = "pack_float_to_unorm2x16";
    break;
  case GLSLstd450PackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              (&local_b8,(spirv_cross *)"as_type<uint>(half2(",(char (*) [21])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3572a7,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar4,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_002b5d5c;
  case GLSLstd450PackDouble2x32:
    uVar5 = *args;
    pcVar12 = "unsupported_GLSLstd450PackDouble2x32";
    break;
  case GLSLstd450UnpackSnorm2x16:
    uVar5 = *args;
    pcVar12 = "unpack_snorm2x16_to_float";
    break;
  case GLSLstd450UnpackUnorm2x16:
    uVar5 = *args;
    pcVar12 = "unpack_unorm2x16_to_float";
    break;
  case GLSLstd450UnpackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (&local_b8,(spirv_cross *)"float2(as_type<half2>(",(char (*) [23])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3572a7,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar4,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
LAB_002b5d5c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      return;
    }
LAB_002b6745:
    operator_delete(local_b8._M_dataplus._M_p);
    return;
  case GLSLstd450UnpackSnorm4x8:
    uVar5 = *args;
    pcVar12 = "unpack_snorm4x8_to_float";
    break;
  case GLSLstd450UnpackUnorm4x8:
    uVar5 = *args;
    pcVar12 = "unpack_unorm4x8_to_float";
    break;
  case GLSLstd450UnpackDouble2x32:
    uVar5 = *args;
    pcVar12 = "unsupported_GLSLstd450UnpackDouble2x32";
    break;
  case GLSLstd450Length:
    pSVar11 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar11->vecsize == 1) {
      uVar5 = *args;
      pcVar12 = "abs";
      break;
    }
    goto switchD_002b59e0_caseD_3;
  case GLSLstd450Distance:
    pSVar11 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar11->vecsize == 1) {
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_d8,&this->super_CompilerGLSL,*args,true);
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_98,&this->super_CompilerGLSL,args[1],true);
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&local_b8,(spirv_cross *)"abs(",(char (*) [5])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x349f71,
                 (char (*) [4])&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,
                 (char (*) [2])in_stack_ffffffffffffff08);
      bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      if (bVar4) {
        bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      else {
        bVar4 = false;
      }
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar4,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,args[1]);
      return;
    }
switchD_002b59e0_caseD_3:
LAB_002b61e5:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    return;
  case GLSLstd450Normalize:
    pSVar11 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar11->vecsize == 1) {
      uVar5 = *args;
      pcVar12 = "sign";
    }
    else {
      uVar5 = *args;
      if ((pSVar11->vecsize < 4) && (*(int *)&(pSVar11->super_IVariant).field_0xc == 0xc)) {
        pcVar12 = "normalize";
      }
      else {
        pcVar12 = "fast::normalize";
      }
    }
    break;
  case GLSLstd450FaceForward:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar11->vecsize == 1) {
      uVar5 = *args;
      uVar8 = args[1];
      op2 = args[2];
      pcVar12 = "spvFaceForward";
      goto LAB_002b6272;
    }
    goto LAB_002b61e5;
  case GLSLstd450Reflect:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar11->vecsize == 1) {
      uVar5 = *args;
      uVar8 = args[1];
      pcVar12 = "spvReflect";
      goto LAB_002b6195;
    }
    goto LAB_002b61e5;
  case GLSLstd450Refract:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar11->vecsize == 1) {
      uVar5 = *args;
      uVar8 = args[1];
      op2 = args[2];
      pcVar12 = "spvRefract";
      goto LAB_002b6272;
    }
    goto LAB_002b61e5;
  case GLSLstd450FindILsb:
    pSVar11 = Compiler::expression_type((Compiler *)this,*args);
    input_type = *(BaseType *)&(pSVar11->super_IVariant).field_0xc;
    uVar5 = *args;
    pcVar12 = "spvFindLSB";
    goto LAB_002b6230;
  case GLSLstd450FindSMsb:
    uVar5 = *args;
    pcVar12 = "spvFindSMSB";
    goto LAB_002b6230;
  case GLSLstd450FindUMsb:
    uVar5 = *args;
    pcVar12 = "spvFindUMSB";
    input_type = BVar6;
LAB_002b6230:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,uVar5,pcVar12,input_type,input_type);
    return;
  case GLSLstd450InterpolateAtCentroid:
    uVar5 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    bVar4 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar4) {
      uVar8 = Compiler::get_extended_decoration
                        ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar13 = (ulong)uVar8;
      if (((uVar13 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.buffer_size) &&
          (pVVar16 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr,
          pVVar16[uVar13].type == TypeConstant)) &&
         (pSVar14 = Variant::get<spirv_cross::SPIRConstant>(pVVar16 + uVar13),
         pSVar14->specialization != true)) {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar14->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x345038,(char (*) [2])&local_98,(char **)pVVar16);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        psVar3 = &local_d8;
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar8,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x3434bc,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33ba6c,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        psVar3 = &local_98;
        local_d8._M_dataplus._M_p = local_98._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &psVar3->field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar15 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar11 = Compiler::get_variable_data_type((Compiler *)this,pSVar15);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar11,uVar5);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[27],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345038,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_centroid()",(char (*) [27])&local_b8,in_stack_ffffffffffffff08);
    bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar4,false);
    psVar3 = &local_d8;
    goto LAB_002b6704;
  case GLSLstd450InterpolateAtSample:
    uVar5 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    bVar4 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar4) {
      uVar8 = Compiler::get_extended_decoration
                        ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar13 = (ulong)uVar8;
      if (((uVar13 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.buffer_size) &&
          (pVVar16 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr,
          pVVar16[uVar13].type == TypeConstant)) &&
         (pSVar14 = Variant::get<spirv_cross::SPIRConstant>(pVVar16 + uVar13),
         pSVar14->specialization != true)) {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar14->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x345038,(char (*) [2])&local_98,(char **)pVVar16);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        psVar3 = &local_d8;
        _Var17._M_p = local_d8._M_dataplus._M_p;
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar8,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x3434bc,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33ba6c,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        psVar3 = &local_98;
        _Var17._M_p = local_98._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != &psVar3->field_2) {
        operator_delete(_Var17._M_p);
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar15 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar11 = Compiler::get_variable_data_type((Compiler *)this,pSVar15);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar11,uVar5);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345038,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_sample(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,
               (char (*) [2])&local_b8,in_stack_ffffffffffffff18);
    bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar4) {
      bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar4 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar4,false);
    goto LAB_002b66e9;
  case GLSLstd450InterpolateAtOffset:
    uVar5 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    bVar4 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar4) {
      uVar8 = Compiler::get_extended_decoration
                        ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar13 = (ulong)uVar8;
      if (((uVar13 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.buffer_size) &&
          (pVVar16 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr,
          pVVar16[uVar13].type == TypeConstant)) &&
         (pSVar14 = Variant::get<spirv_cross::SPIRConstant>(pVVar16 + uVar13),
         pSVar14->specialization != true)) {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar14->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x345038,(char (*) [2])&local_98,(char **)pVVar16);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        psVar3 = &local_d8;
        _Var17._M_p = local_d8._M_dataplus._M_p;
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar8,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x3434bc,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33ba6c,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        psVar3 = &local_98;
        _Var17._M_p = local_98._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != &psVar3->field_2) {
        operator_delete(_Var17._M_p);
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar15 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar11 = Compiler::get_variable_data_type((Compiler *)this,pSVar15);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar11,uVar5);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[11],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345038,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_offset(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + 0.4375)",
               (char (*) [11])&local_b8,in_stack_ffffffffffffff18);
    bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar4) {
      bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar4 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar4,false);
LAB_002b66e9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    psVar3 = &local_50;
LAB_002b6704:
    puVar2 = *(undefined1 **)((psVar3->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 != &psVar3->field_2) {
      operator_delete(puVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      return;
    }
    goto LAB_002b6745;
  case GLSLstd450NMin:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar5 = *args;
    uVar8 = args[1];
    if (*(int *)&(pSVar11->super_IVariant).field_0xc == 0xd) {
      pcVar12 = "precise::min";
      goto LAB_002b6195;
    }
LAB_002b602f:
    pcVar12 = "min";
LAB_002b6195:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,result_type,id,uVar5,uVar8,pcVar12);
    return;
  case GLSLstd450NMax:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar5 = *args;
    uVar8 = args[1];
    if (*(int *)&(pSVar11->super_IVariant).field_0xc == 0xd) {
      pcVar12 = "precise::max";
      goto LAB_002b6195;
    }
LAB_002b6189:
    pcVar12 = "max";
    goto LAB_002b6195;
  case GLSLstd450NClamp:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar5 = *args;
    uVar8 = args[1];
    op2 = args[2];
    if (*(int *)&(pSVar11->super_IVariant).field_0xc == 0xd) {
      pcVar12 = "precise::clamp";
      goto LAB_002b6272;
    }
LAB_002b626b:
    pcVar12 = "clamp";
LAB_002b6272:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,uVar5,uVar8,op2,pcVar12);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,uVar5,pcVar12);
  return;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	switch (op)
	{
	case GLSLstd450Sinh:
		emit_unary_func_op(result_type, id, args[0], "fast::sinh");
		break;
	case GLSLstd450Cosh:
		emit_unary_func_op(result_type, id, args[0], "fast::cosh");
		break;
	case GLSLstd450Tanh:
		emit_unary_func_op(result_type, id, args[0], "precise::tanh");
		break;
	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "precise::atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

	case GLSLstd450InterpolateAtCentroid:
	{
		// We can't just emit the expression normally, because the qualified name contains a call to the default
		// interpolate method, or refers to a local variable. We saved the interface index we need; use it to construct
		// the base for the method call.
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_centroid()", component),
		        should_forward(args[0]));
		break;
	}

	case GLSLstd450InterpolateAtSample:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_sample(", to_expression(args[1]), ")", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450InterpolateAtOffset:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		// Like Direct3D, Metal puts the (0, 0) at the upper-left corner, not the center as SPIR-V and GLSL do.
		// Offset the offset by (1/2 - 1/16), or 0.4375, to compensate for this.
		// It has to be (1/2 - 1/16) and not 1/2, or several CTS tests subtly break on Intel.
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_offset(", to_expression(args[1]), " + 0.4375)", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions, so use abs().
		if (expression_type(args[0]).vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "abs");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
	{
		auto &exp_type = expression_type(args[0]);
		// MSL does not support scalar versions here.
		// MSL has no implementation for normalize in the fast:: namespace for half2 and half3
		// Returns -1 or 1 for valid input, sign() does the job.
		if (exp_type.vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "sign");
		else if (exp_type.vecsize <= 3 && exp_type.basetype == SPIRType::Half)
			emit_unary_func_op(result_type, id, args[0], "normalize");
		else
			emit_unary_func_op(result_type, id, args[0], "fast::normalize");
		break;
	}
	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		// Another special case is if the variable is in a storage class which is not thread.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		auto &type = expression_type(args[1]);

		bool is_thread_storage = storage_class_array_is_thread(type.storage);
		if (type.storage == StorageClassOutput && capture_output_to_buffer)
			is_thread_storage = false;

		if (!is_thread_storage ||
		    (ptr && ptr->access_chain && is_scalar(expression_type(args[1]))))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(expression_type_id(args[1]));
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}